

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void proxy_telnet_process_queue(ProxyNegotiator *pn)

{
  int iVar1;
  int iVar2;
  SeatPromptResult spr_00;
  SeatPromptResult spr_01;
  _Bool _Var3;
  BinarySink **ctx;
  Interactor *pIVar4;
  prompts_t *ppVar5;
  InteractionReadySeat iseat;
  char *pcVar6;
  strbuf *buf_o;
  undefined4 uVar7;
  ptrlen pVar8;
  undefined8 in_stack_ffffffffffffff28;
  strbuf *logmsg;
  char *censored_cmd;
  undefined1 local_48 [8];
  SeatPromptResult spr;
  uint flags;
  int *crLine;
  TelnetProxyNegotiator *s;
  ProxyNegotiator *pn_local;
  
  ctx = &pn[-1].output[0].binarysink_[0].binarysink_;
  iVar1 = *(int *)ctx;
  if (iVar1 == 0) {
    pIVar4 = (Interactor *)conf_copy(pn->ps->conf);
    pn[-1].itr = pIVar4;
    pcVar6 = format_telnet_command
                       (pn->ps->remote_addr,pn->ps->remote_port,(Conf *)pn[-1].itr,
                        (uint *)&spr.field_0x1c);
    *(char **)&pn[-1].done = pcVar6;
    if ((pn->itr != (Interactor *)0x0) && ((spr._28_4_ & 3) != 0)) {
      burnstr(*(char **)&pn[-1].done);
      *(undefined8 *)&pn[-1].done = 0;
      ppVar5 = proxy_new_prompts(pn->ps);
      pn[-1].error = &ppVar5->to_server;
      *pn[-1].error = '\x01';
      pn[-1].error[1] = '\0';
      pcVar6 = dupstr("Telnet proxy authentication");
      *(char **)(pn[-1].error + 8) = pcVar6;
      if ((spr._28_4_ & 1) == 0) {
        pn[-1].aborted = true;
        pn[-1].reconnect = true;
        *(undefined2 *)&pn[-1].field_0x52 = 0xffff;
      }
      else {
        uVar7 = (undefined4)*(undefined8 *)(pn[-1].error + 0x28);
        pn[-1].aborted = (_Bool)(char)uVar7;
        pn[-1].reconnect = (_Bool)(char)((uint)uVar7 >> 8);
        *(short *)&pn[-1].field_0x52 = (short)((uint)uVar7 >> 0x10);
        ppVar5 = (prompts_t *)pn[-1].error;
        pcVar6 = dupstr("Proxy username: ");
        add_prompt(ppVar5,pcVar6,true);
      }
      if ((spr._28_4_ & 2) == 0) {
        *(undefined4 *)&pn[-1].field_0x54 = 0xffffffff;
      }
      else {
        *(int *)&pn[-1].field_0x54 = (int)*(undefined8 *)(pn[-1].error + 0x28);
        ppVar5 = (prompts_t *)pn[-1].error;
        pcVar6 = dupstr("Proxy password: ");
        add_prompt(ppVar5,pcVar6,false);
      }
      queue_toplevel_callback(proxy_telnet_process_queue_callback,ctx);
      *(undefined4 *)ctx = 0x120;
      return;
    }
  }
  else {
    if ((iVar1 != 0x120) && (iVar1 != 299)) goto LAB_001123a7;
    iseat = interactor_announce(pn->itr);
    seat_get_userpass_input((SeatPromptResult *)local_48,iseat,(prompts_t *)pn[-1].error);
    if (local_48._0_4_ != SPRK_OK) {
      spr_01.errfn = spr.errfn;
      spr_01.kind = spr.kind;
      spr_01._4_4_ = spr._4_4_;
      spr_01.errdata_lit = spr.errdata_lit;
      spr_01._24_8_ = in_stack_ffffffffffffff28;
      _Var3 = spr_is_abort(spr_01);
      if (!_Var3) {
        *(undefined4 *)ctx = 299;
        return;
      }
      spr_00._4_4_ = local_48._4_4_;
      spr_00.kind = local_48._0_4_;
      spr_00.errfn = (_func_void_SeatPromptResult_BinarySink_ptr *)spr._0_8_;
      spr_00.errdata_lit = (char *)spr.errfn;
      spr_00._24_8_ = spr.errdata_lit;
      proxy_spr_abort(pn,spr_00);
      *(undefined4 *)ctx = 0;
      return;
    }
    iVar1._0_1_ = pn[-1].aborted;
    iVar1._1_1_ = pn[-1].reconnect;
    iVar1._2_2_ = *(undefined2 *)&pn[-1].field_0x52;
    if (iVar1 != -1) {
      pIVar4 = pn[-1].itr;
      iVar2._0_1_ = pn[-1].aborted;
      iVar2._1_1_ = pn[-1].reconnect;
      iVar2._2_2_ = *(undefined2 *)&pn[-1].field_0x52;
      pcVar6 = prompt_get_result_ref
                         (*(prompt_t **)(*(long *)(pn[-1].error + 0x38) + (long)iVar2 * 8));
      conf_set_str((Conf *)pIVar4,0x10,pcVar6);
    }
    if (*(int *)&pn[-1].field_0x54 != -1) {
      pIVar4 = pn[-1].itr;
      pcVar6 = prompt_get_result_ref
                         (*(prompt_t **)
                           (*(long *)(pn[-1].error + 0x38) + (long)*(int *)&pn[-1].field_0x54 * 8));
      conf_set_str((Conf *)pIVar4,0x11,pcVar6);
    }
    free_prompts((prompts_t *)pn[-1].error);
    pn[-1].error = (char *)0x0;
  }
  pcVar6 = format_telnet_command
                     (pn->ps->remote_addr,pn->ps->remote_port,(Conf *)pn[-1].itr,(uint *)0x0);
  *(char **)&pn[-1].done = pcVar6;
  conf_set_str((Conf *)pn[-1].itr,0x11,"*password*");
  pcVar6 = format_telnet_command
                     (pn->ps->remote_addr,pn->ps->remote_port,(Conf *)pn[-1].itr,(uint *)0x0);
  buf_o = strbuf_new();
  pVar8 = make_ptrlen("Sending Telnet proxy command: ",0x1e);
  BinarySink_put_datapl(buf_o->binarysink_,pVar8);
  pVar8 = ptrlen_from_asciz(pcVar6);
  BinarySink_put_c_string_literal(buf_o->binarysink_,pVar8);
  plug_log(pn->ps->plug,3,(SockAddr *)0x0,0,buf_o->s,0);
  strbuf_free(buf_o);
  safefree(pcVar6);
  pVar8 = ptrlen_from_asciz(*(char **)&pn[-1].done);
  BinarySink_put_datapl(pn->output[0].binarysink_,pVar8);
  pn->done = true;
LAB_001123a7:
  *(undefined4 *)ctx = 0;
  return;
}

Assistant:

static void proxy_telnet_process_queue(ProxyNegotiator *pn)
{
    TelnetProxyNegotiator *s = container_of(pn, TelnetProxyNegotiator, pn);

    crBegin(s->crLine);

    s->conf = conf_copy(pn->ps->conf);

    /*
     * Make an initial attempt to figure out the command we want, and
     * see if it tried to include a username or password that we don't
     * have.
     */
    {
        unsigned flags;
        s->formatted_cmd = format_telnet_command(
            pn->ps->remote_addr, pn->ps->remote_port, s->conf, &flags);

        if (pn->itr && (flags & (TELNET_CMD_MISSING_USERNAME |
                                 TELNET_CMD_MISSING_PASSWORD))) {
            burnstr(s->formatted_cmd);
            s->formatted_cmd = NULL;

            /*
             * We're missing at least one of the two parts, and we
             * have an Interactor we can use to prompt for them, so
             * try it.
             */
            s->prompts = proxy_new_prompts(pn->ps);
            s->prompts->to_server = true;
            s->prompts->from_server = false;
            s->prompts->name = dupstr("Telnet proxy authentication");
            if (flags & TELNET_CMD_MISSING_USERNAME) {
                s->username_prompt_index = s->prompts->n_prompts;
                add_prompt(s->prompts, dupstr("Proxy username: "), true);
            } else {
                s->username_prompt_index = -1;
            }
            if (flags & TELNET_CMD_MISSING_PASSWORD) {
                s->password_prompt_index = s->prompts->n_prompts;
                add_prompt(s->prompts, dupstr("Proxy password: "), false);
            } else {
                s->password_prompt_index = -1;
            }

            /*
             * This prompt is presented extremely early in PuTTY's
             * setup. (Very promptly, you might say.)
             *
             * In particular, we can get here through a chain of
             * synchronous calls from backend_init, which means (in
             * GUI PuTTY) that the terminal we'll be sending this
             * prompt to may not have its Ldisc set up yet (due to
             * cyclic dependencies among all the things that have to
             * be initialised).
             *
             * So we'll start by having ourself called back via a
             * toplevel callback, to make sure we don't call
             * seat_get_userpass_input until we've returned from
             * backend_init and the frontend has finished getting
             * everything ready.
             */
            queue_toplevel_callback(proxy_telnet_process_queue_callback, s);
            crReturnV;

            while (true) {
                SeatPromptResult spr = seat_get_userpass_input(
                    interactor_announce(pn->itr), s->prompts);
                if (spr.kind == SPRK_OK) {
                    break;
                } else if (spr_is_abort(spr)) {
                    proxy_spr_abort(pn, spr);
                    crStopV;
                }
                crReturnV;
            }

            if (s->username_prompt_index != -1) {
                conf_set_str(
                    s->conf, CONF_proxy_username,
                    prompt_get_result_ref(
                        s->prompts->prompts[s->username_prompt_index]));
            }

            if (s->password_prompt_index != -1) {
                conf_set_str(
                    s->conf, CONF_proxy_password,
                    prompt_get_result_ref(
                        s->prompts->prompts[s->password_prompt_index]));
            }

            free_prompts(s->prompts);
            s->prompts = NULL;
        }

        /*
         * Now format the command a second time, with the results of
         * those prompts written into s->conf.
         */
        s->formatted_cmd = format_telnet_command(
            pn->ps->remote_addr, pn->ps->remote_port, s->conf, NULL);
    }

    /*
     * Log the command, with some changes. Firstly, we regenerate it
     * with the password masked; secondly, we escape control
     * characters so that the log message is printable.
     */
    conf_set_str(s->conf, CONF_proxy_password, "*password*");
    {
        char *censored_cmd = format_telnet_command(
            pn->ps->remote_addr, pn->ps->remote_port, s->conf, NULL);

        strbuf *logmsg = strbuf_new();
        put_datapl(logmsg, PTRLEN_LITERAL("Sending Telnet proxy command: "));
        put_c_string_literal(logmsg, ptrlen_from_asciz(censored_cmd));

        plug_log(pn->ps->plug, PLUGLOG_PROXY_MSG, NULL, 0, logmsg->s, 0);
        strbuf_free(logmsg);
        sfree(censored_cmd);
    }

    /*
     * Actually send the command.
     */
    put_dataz(pn->output, s->formatted_cmd);

    /*
     * Unconditionally report success. We don't hang around waiting
     * for error messages from the proxy, because this proxy type is
     * so ad-hoc that we wouldn't know how to even recognise an error
     * message if we saw one, let alone what to do about it.
     */
    pn->done = true;

    crFinishV;
}